

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa_sig.c
# Opt level: O0

int rsa_pss_compute_saltlen(PROV_RSA_CTX_conflict1 *ctx)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  char *in_RDI;
  int saltlen;
  char *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe8;
  int in_stack_fffffffffffffffc;
  
  uVar1 = *(uint *)(in_RDI + 0xb0);
  if (uVar1 == 0xffffffff) {
    uVar1 = EVP_MD_get_size((EVP_MD *)CONCAT44(0xffffffff,in_stack_ffffffffffffffe8));
  }
  else if ((uVar1 == 0xfffffffe) || (uVar1 == 0xfffffffd)) {
    iVar2 = RSA_size(*(RSA **)(in_RDI + 0x10));
    iVar3 = EVP_MD_get_size((EVP_MD *)CONCAT44(uVar1,iVar2));
    uVar1 = (iVar2 - iVar3) - 2;
    uVar4 = RSA_bits((RSA *)0x34ab1c);
    if ((uVar4 & 7) == 1) {
      uVar1 = uVar1 - 1;
    }
  }
  if ((int)uVar1 < 0) {
    ERR_new();
    ERR_set_debug(unaff_retaddr,in_stack_fffffffffffffffc,in_RDI);
    ERR_set_error(0x39,0xc0103,(char *)0x0);
    uVar1 = 0xffffffff;
  }
  else if ((int)uVar1 < *(int *)(in_RDI + 0xb4)) {
    ERR_new();
    ERR_set_debug(unaff_retaddr,in_stack_fffffffffffffffc,in_RDI);
    ERR_set_error(0x39,0xac,"minimum salt length: %d, actual salt length: %d",
                  (ulong)*(uint *)(in_RDI + 0xb4),(ulong)uVar1);
    uVar1 = 0xffffffff;
  }
  return uVar1;
}

Assistant:

static int rsa_pss_compute_saltlen(PROV_RSA_CTX *ctx)
{
    int saltlen = ctx->saltlen;
 
    if (saltlen == RSA_PSS_SALTLEN_DIGEST) {
        saltlen = EVP_MD_get_size(ctx->md);
    } else if (saltlen == RSA_PSS_SALTLEN_AUTO || saltlen == RSA_PSS_SALTLEN_MAX) {
        saltlen = RSA_size(ctx->rsa) - EVP_MD_get_size(ctx->md) - 2;
        if ((RSA_bits(ctx->rsa) & 0x7) == 1)
            saltlen--;
    }
    if (saltlen < 0) {
        ERR_raise(ERR_LIB_PROV, ERR_R_INTERNAL_ERROR);
        return -1;
    } else if (saltlen < ctx->min_saltlen) {
        ERR_raise_data(ERR_LIB_PROV, PROV_R_PSS_SALTLEN_TOO_SMALL,
                       "minimum salt length: %d, actual salt length: %d",
                       ctx->min_saltlen, saltlen);
        return -1;
    }
    return saltlen;
}